

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::PositionalBase::Reset(PositionalBase *this)

{
  (this->super_NamedBase).super_Base.matched = false;
  (this->super_NamedBase).field_0x99 = 1;
  return;
}

Assistant:

virtual void Reset() noexcept override
            {
                matched = false;
                ready = true;
#ifdef ARGS_NOEXCEPT
                error = Error::None;
                errorMsg.clear();
#endif
            }